

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

bool dxil_spv::emit_annotate_node_handle(Impl *impl,CallInst *inst)

{
  CallInst *value;
  CallInst *this;
  bool bVar1;
  Id id;
  Value *pVVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  value_type *node_meta;
  CallInst *pCStack_28;
  uint32_t node_meta_index;
  CallInst *node_output;
  CallInst *inst_local;
  Impl *impl_local;
  
  node_output = inst;
  inst_local = (CallInst *)impl;
  pVVar2 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar1 = value_is_dx_op_instrinsic(pVVar2,IndexNodeHandle);
  this = inst_local;
  value = node_output;
  if (bVar1) {
    pVVar2 = LLVMBC::Instruction::getOperand(&node_output->super_Instruction,1);
    id = Converter::Impl::get_id_for_value((Impl *)this,pVVar2,0);
    Converter::Impl::rewrite_value((Impl *)this,(Value *)value,id);
    impl_local._7_1_ = true;
  }
  else {
    pVVar2 = LLVMBC::Instruction::getOperand(&node_output->super_Instruction,1);
    bVar1 = value_is_dx_op_instrinsic(pVVar2,CreateNodeOutputHandle);
    if (bVar1) {
      pVVar2 = LLVMBC::Instruction::getOperand(&node_output->super_Instruction,1);
      pCStack_28 = LLVMBC::cast<LLVMBC::CallInst>(pVVar2);
      node_meta._4_4_ = 0;
      bVar1 = get_constant_operand
                        (&pCStack_28->super_Instruction,1,(uint32_t *)((long)&node_meta + 4));
      if (bVar1) {
        uVar3 = (ulong)node_meta._4_4_;
        sVar4 = std::
                vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                ::size((vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                        *)&inst_local[0x16].super_Instruction.operands.
                           super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar3 < sVar4) {
          pvVar5 = std::
                   vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                   ::operator[]((vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                                 *)&inst_local[0x16].super_Instruction.operands.
                                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)node_meta._4_4_);
          Converter::Impl::rewrite_value
                    ((Impl *)inst_local,(Value *)node_output,pvVar5->spec_constant_node_index);
          impl_local._7_1_ = true;
        }
        else {
          impl_local._7_1_ = false;
        }
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_annotate_node_handle(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// Not sure why there are two separate opcodes for annotating a handle, but DXIL's gonna DXIL ...
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		// Trivially forward the annotation.
		impl.rewrite_value(inst, impl.get_id_for_value(inst->getOperand(1)));
		return true;
	}

	if (!value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::CreateNodeOutputHandle))
		return false;

	auto *node_output = llvm::cast<llvm::CallInst>(inst->getOperand(1));
	uint32_t node_meta_index = 0;
	if (!get_constant_operand(node_output, 1, &node_meta_index))
		return false;

	if (node_meta_index >= impl.node_outputs.size())
		return false;

	auto &node_meta = impl.node_outputs[node_meta_index];
	impl.rewrite_value(inst, node_meta.spec_constant_node_index);
	return true;
}